

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__profile_GLES__technique__pass__light_ambient
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 in_RAX;
  byte *pbVar4;
  StringHash SVar5;
  uint64 uVar6;
  char cVar7;
  xmlChar **ppxVar8;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pbVar4 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x28);
  uVar1 = profile_GLES__technique__pass__light_ambient__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar4 = profile_GLES__technique__pass__light_ambient__AttributeData::DEFAULT._0_8_
  ;
  *(undefined8 *)(pbVar4 + 8) = uVar1;
  uVar1 = profile_GLES__technique__pass__light_ambient__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(pbVar4 + 0x10) =
       profile_GLES__technique__pass__light_ambient__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(pbVar4 + 0x18) = uVar1;
  *(undefined8 *)(pbVar4 + 0x20) =
       profile_GLES__technique__pass__light_ambient__AttributeData::DEFAULT._32_8_;
  *attributeDataPtr = pbVar4;
  ppxVar8 = attributes->attributes;
  if (ppxVar8 != (xmlChar **)0x0) {
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        cVar7 = '\x03';
        goto LAB_006b6ff8;
      }
      SVar5 = GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar8[1];
      ppxVar8 = ppxVar8 + 2;
      if (SVar5 == 0x704ac8) {
        uVar6 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 7));
        *(uint64 *)(pbVar4 + 0x20) = uVar6;
        if (uStack_38._7_1_ == '\x01') {
          bVar2 = false;
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x6c50274,0x704ac8,buffer);
          if (!bVar3) goto LAB_006b6fde;
          cVar7 = '\x01';
        }
        else {
LAB_006b6fde:
          cVar7 = '\x04';
          bVar2 = true;
          if (uStack_38._7_1_ == '\0') {
            *pbVar4 = *pbVar4 | 2;
          }
        }
        if (bVar2) goto LAB_006b6ff6;
      }
      else if (SVar5 == 0x76887d) {
        *(ParserChar **)(pbVar4 + 0x18) = buffer;
LAB_006b6ff6:
        cVar7 = '\0';
      }
      else if (SVar5 == 0x7c83b5) {
        bVar2 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                           ,buffer,(XSList<float> *)(pbVar4 + 8));
        if (bVar2) {
          *pbVar4 = *pbVar4 | 1;
          cVar7 = '\x04';
          bVar2 = true;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x6c50274,0x7c83b5,buffer);
          bVar2 = !bVar2;
          cVar7 = bVar2 * '\x03' + '\x01';
        }
        if (bVar2) goto LAB_006b6ff6;
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x6c50274,text,buffer);
        cVar7 = '\x01';
        if (!bVar2) goto LAB_006b6ff6;
      }
LAB_006b6ff8:
    } while (cVar7 == '\0');
    if (cVar7 != '\x03') {
      return false;
    }
  }
  if (((*pbVar4 & 1) == 0) &&
     (bVar2 = GeneratedSaxParser::
              ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
              ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                        (&this->
                          super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                         ,"0.0E1 0.0E1 0.0E1 1.0E0",(XSList<float> *)(pbVar4 + 8)), bVar2)) {
    *pbVar4 = *pbVar4 | 1;
  }
  if (((*pbVar4 & 2) == 0) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x6c50274,0x704ac8,(ParserChar *)0x0),
     bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__light_ambient( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__light_ambient( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__light_ambient__AttributeData* attributeData = newData<profile_GLES__technique__pass__light_ambient__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_LIGHT_AMBIENT, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIGHT_AMBIENT,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_AMBIENT,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__light_ambient__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_AMBIENT,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIGHT_AMBIENT,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__GLES_MAX_LIGHTS_index(attributeData->index);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_AMBIENT,
            HASH_ATTRIBUTE_index,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif
if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__light_ambient__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_LIGHT_AMBIENT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLES__technique__pass__light_ambient__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    bool failed;
    failed = !characterData2FloatList("0.0E1 0.0E1 0.0E1 1.0E0", attributeData->value);
    if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__light_ambient__AttributeData::ATTRIBUTE_VALUE_PRESENT;
}
if ( (attributeData->present_attributes & profile_GLES__technique__pass__light_ambient__AttributeData::ATTRIBUTE_INDEX_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_LIGHT_AMBIENT, HASH_ATTRIBUTE_index, 0 ) )
        return false;
}


    return true;
}